

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfoMB * __thiscall
embree::sse2::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::sse2::CurveGeometryInterface,_embree::BezierCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  BBox1f BVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  BufferView<embree::Vec3fa> *pBVar5;
  char *pcVar6;
  PrimRefMB *pPVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  undefined4 uVar25;
  BufferView<embree::Vec3fa> *pBVar26;
  uint uVar27;
  long lVar28;
  int i;
  size_t sVar29;
  ulong uVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar36 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar58;
  float fVar59;
  undefined1 auVar60 [12];
  float fVar70;
  Vec3fa n1;
  float fVar71;
  float fVar72;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar69;
  float fVar73;
  Vec3fa n0;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar92;
  float fVar101;
  float fVar106;
  float fVar107;
  Vec3ff v3;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar105;
  float fVar108;
  float fVar110;
  undefined1 auVar111 [12];
  float fVar120;
  vfloat4 a;
  float fVar109;
  float fVar122;
  undefined1 auVar112 [16];
  float fVar121;
  float fVar123;
  float fVar124;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar119;
  float fVar125;
  float fVar126;
  uint uVar127;
  undefined1 auVar128 [12];
  float fVar132;
  uint uVar133;
  float fVar134;
  uint uVar135;
  float fVar136;
  uint uVar137;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar131;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar147;
  float fVar151;
  vfloat4 a_1;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  undefined1 auVar172 [16];
  uint uVar176;
  uint uVar179;
  uint uVar180;
  uint uVar181;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar185;
  float fVar186;
  float fVar188;
  float fVar189;
  float fVar190;
  undefined1 auVar187 [16];
  float fVar191;
  float fVar194;
  float fVar195;
  float fVar196;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  undefined1 local_3a8 [16];
  float local_390;
  float local_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_378;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_368;
  undefined1 local_328 [16];
  uint local_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  ulong local_2f8;
  unsigned_long local_288;
  size_t local_280;
  size_t local_278;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_248;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_238;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_228;
  BBox1f local_218;
  anon_class_16_2_07cfa4d6 local_f0;
  ulong local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_d8;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_b8;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar18;
  
  local_228 = _DAT_01feb9f0;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = _DAT_01feb9f0;
  local_238 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = _DAT_01feba00;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = local_238;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_238;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  *(undefined1 **)&(__return_storage_ptr__->max_time_range).upper = &DAT_3f8000003f800000;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar30 = r->_begin;
  local_390 = (__return_storage_ptr__->time_range).lower;
  local_38c = 0.0;
  local_280 = __return_storage_ptr__->num_time_segments;
  local_2f8 = __return_storage_ptr__->max_num_time_segments;
  local_218 = __return_storage_ptr__->max_time_range;
  local_248 = local_238;
  aVar92 = local_228;
  aVar105 = local_238;
  aVar119 = local_228;
  if (uVar30 < r->_end) {
    local_288 = (__return_storage_ptr__->object_range)._end;
    local_278 = k;
    do {
      BVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
              super_Geometry.time_range;
      fVar17 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               super_Geometry.fnumTimeSegments;
      fVar35 = t0t1->lower;
      fVar34 = t0t1->upper;
      fVar33 = BVar3.lower;
      fVar73 = BVar3.upper - fVar33;
      fVar32 = floorf(((fVar35 - fVar33) / fVar73) * 1.0000002 * fVar17);
      fVar33 = ceilf(((fVar34 - fVar33) / fVar73) * 0.99999976 * fVar17);
      uVar27 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                   super_CurveGeometry.super_Geometry.field_0x58 +
                        *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.field_0x68 * uVar30);
      uVar18 = (ulong)(uVar27 + 3);
      pBVar4 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar18 < (pBVar4->super_RawBufferView).num) {
        fVar73 = 0.0;
        if (0.0 <= fVar32) {
          fVar73 = fVar32;
        }
        uVar20 = (uint)fVar73;
        if (fVar17 <= fVar33) {
          fVar33 = fVar17;
        }
        uVar22 = (uint)fVar33;
        bVar31 = uVar22 < uVar20;
        if (uVar20 <= uVar22) {
          uVar21 = (ulong)(int)uVar20;
          pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   normals.items;
          fVar33 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          pBVar26 = pBVar5;
          do {
            pcVar6 = pBVar4[uVar21].super_RawBufferView.ptr_ofs;
            sVar29 = pBVar4[uVar21].super_RawBufferView.stride;
            lVar19 = sVar29 * uVar27;
            lVar23 = sVar29 * (uVar27 + 1);
            lVar28 = sVar29 * (uVar27 + 2);
            fVar32 = (float)DAT_01ff0930;
            fVar73 = DAT_01ff0930._4_4_;
            fVar160 = DAT_01ff0930._8_4_;
            fVar155 = DAT_01ff0930._12_4_;
            auVar112._4_4_ = -(uint)(fVar73 <= ABS(*(float *)(pcVar6 + lVar23 + 0xc)));
            auVar112._0_4_ = -(uint)(fVar32 <= ABS(*(float *)(pcVar6 + lVar19 + 0xc)));
            auVar112._8_4_ = -(uint)(fVar160 <= ABS(*(float *)(pcVar6 + lVar28 + 0xc)));
            auVar112._12_4_ = -(uint)(fVar155 <= ABS(*(float *)(pcVar6 + sVar29 * uVar18 + 0xc)));
            iVar24 = movmskps((int)pBVar26,auVar112);
            if (iVar24 != 0) {
LAB_00a6d906:
              if (!bVar31) goto LAB_00a6de96;
              break;
            }
            pfVar1 = (float *)(pcVar6 + lVar19);
            fVar87 = *pfVar1;
            fVar94 = pfVar1[1];
            fVar98 = pfVar1[2];
            fVar108 = pfVar1[3];
            fVar125 = (float)DAT_01ff0920;
            fVar132 = DAT_01ff0920._4_4_;
            fVar134 = DAT_01ff0920._8_4_;
            fVar136 = DAT_01ff0920._12_4_;
            auVar161._0_4_ = -(uint)(fVar87 < fVar32 && fVar125 < fVar87);
            auVar161._4_4_ = -(uint)(fVar94 < fVar73 && fVar132 < fVar94);
            auVar161._8_4_ = -(uint)(fVar98 < fVar160 && fVar134 < fVar98);
            auVar161._12_4_ = -(uint)(fVar108 < fVar155 && fVar136 < fVar108);
            uVar25 = movmskps(0,auVar161);
            pBVar26 = (BufferView<embree::Vec3fa> *)
                      (ulong)CONCAT31((int3)((uint)uVar25 >> 8),~(byte)uVar25);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            pfVar1 = (float *)(pcVar6 + lVar23);
            fVar158 = *pfVar1;
            fVar167 = pfVar1[1];
            fVar169 = pfVar1[2];
            fVar86 = pfVar1[3];
            auVar61._0_4_ = -(uint)(fVar158 < fVar32 && fVar125 < fVar158);
            auVar61._4_4_ = -(uint)(fVar167 < fVar73 && fVar132 < fVar167);
            auVar61._8_4_ = -(uint)(fVar169 < fVar160 && fVar134 < fVar169);
            auVar61._12_4_ = -(uint)(fVar86 < fVar155 && fVar136 < fVar86);
            uVar25 = movmskps((int)lVar23,auVar61);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            pfVar1 = (float *)(pcVar6 + lVar28);
            fVar88 = *pfVar1;
            fVar120 = pfVar1[1];
            fVar122 = pfVar1[2];
            fVar95 = pfVar1[3];
            auVar74._0_4_ = -(uint)(fVar88 < fVar32 && fVar125 < fVar88);
            auVar74._4_4_ = -(uint)(fVar120 < fVar73 && fVar132 < fVar120);
            auVar74._8_4_ = -(uint)(fVar122 < fVar160 && fVar134 < fVar122);
            auVar74._12_4_ = -(uint)(fVar95 < fVar155 && fVar136 < fVar95);
            uVar25 = movmskps(CONCAT31((int3)((uint)uVar25 >> 8),~(byte)uVar25),auVar74);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            pfVar1 = (float *)(pcVar6 + sVar29 * uVar18);
            fVar96 = *pfVar1;
            fVar99 = pfVar1[1];
            fVar100 = pfVar1[2];
            fVar109 = pfVar1[3];
            auVar102._0_4_ = -(uint)(fVar96 < fVar32 && fVar125 < fVar96);
            auVar102._4_4_ = -(uint)(fVar99 < fVar73 && fVar132 < fVar99);
            auVar102._8_4_ = -(uint)(fVar100 < fVar160 && fVar134 < fVar100);
            auVar102._12_4_ = -(uint)(fVar109 < fVar155 && fVar136 < fVar109);
            uVar25 = movmskps(CONCAT31((int3)((uint)uVar25 >> 8),~(byte)uVar25),auVar102);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            pcVar6 = pBVar5[uVar21].super_RawBufferView.ptr_ofs;
            sVar29 = pBVar5[uVar21].super_RawBufferView.stride;
            lVar19 = sVar29 * uVar27;
            pfVar1 = (float *)(pcVar6 + lVar19);
            fVar126 = *pfVar1;
            fVar150 = pfVar1[1];
            fVar154 = pfVar1[2];
            auVar183._0_4_ = -(uint)(fVar126 < fVar32 && fVar125 < fVar126);
            auVar183._4_4_ = -(uint)(fVar150 < fVar73 && fVar132 < fVar150);
            auVar183._8_4_ = -(uint)(fVar154 < fVar160 && fVar134 < fVar154);
            auVar183._12_4_ = -(uint)(pfVar1[3] < fVar155 && fVar136 < pfVar1[3]);
            uVar25 = movmskps((int)lVar19,auVar183);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            lVar19 = sVar29 * (uVar27 + 1);
            pfVar1 = (float *)(pcVar6 + lVar19);
            fVar101 = *pfVar1;
            fVar106 = pfVar1[1];
            fVar107 = pfVar1[2];
            auVar187._0_4_ = -(uint)(fVar101 < fVar32 && fVar125 < fVar101);
            auVar187._4_4_ = -(uint)(fVar106 < fVar73 && fVar132 < fVar106);
            auVar187._8_4_ = -(uint)(fVar107 < fVar160 && fVar134 < fVar107);
            auVar187._12_4_ = -(uint)(pfVar1[3] < fVar155 && fVar136 < pfVar1[3]);
            uVar25 = movmskps((int)lVar19,auVar187);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            fVar108 = fVar108 * fVar33;
            fVar109 = fVar109 * fVar33;
            lVar19 = sVar29 * (uVar27 + 2);
            pfVar1 = (float *)(pcVar6 + lVar19);
            pfVar2 = (float *)(pcVar6 + sVar29 * uVar18);
            fVar141 = *pfVar2;
            fVar142 = pfVar2[1];
            fVar159 = pfVar2[2];
            fVar190 = fVar95 * fVar33 * 0.0;
            fVar138 = fVar96 * 0.0 + fVar88 * 0.0;
            fVar147 = fVar99 * 0.0 + fVar120 * 0.0;
            fVar151 = fVar100 * 0.0 + fVar122 * 0.0;
            fVar156 = fVar109 * 0.0 + fVar190;
            fVar157 = fVar158 * 0.0;
            fVar166 = fVar167 * 0.0;
            fVar168 = fVar169 * 0.0;
            fVar170 = fVar86 * fVar33 * 0.0;
            fVar191 = fVar157 + fVar138 + fVar87;
            fVar194 = fVar166 + fVar147 + fVar94;
            fVar195 = fVar168 + fVar151 + fVar98;
            fVar196 = fVar170 + fVar156 + fVar108;
            fVar138 = (fVar158 * 3.0 + fVar138) - fVar87 * 3.0;
            fVar147 = (fVar167 * 3.0 + fVar147) - fVar94 * 3.0;
            fVar151 = (fVar169 * 3.0 + fVar151) - fVar98 * 3.0;
            fVar156 = (fVar86 * fVar33 * 3.0 + fVar156) - fVar108 * 3.0;
            fVar86 = *pfVar1 * 0.0;
            fVar93 = pfVar1[1] * 0.0;
            fVar97 = pfVar1[2] * 0.0;
            fVar158 = fVar141 * 0.0 + fVar86;
            fVar167 = fVar142 * 0.0 + fVar93;
            fVar169 = fVar159 * 0.0 + fVar97;
            fVar139 = fVar101 * 0.0;
            fVar148 = fVar106 * 0.0;
            fVar152 = fVar107 * 0.0;
            fVar140 = fVar139 + fVar158 + fVar126;
            fVar149 = fVar148 + fVar167 + fVar150;
            fVar153 = fVar152 + fVar169 + fVar154;
            fVar158 = (fVar101 * 3.0 + fVar158) - fVar126 * 3.0;
            fVar167 = (fVar106 * 3.0 + fVar167) - fVar150 * 3.0;
            fVar169 = (fVar107 * 3.0 + fVar169) - fVar154 * 3.0;
            fVar186 = fVar88 * 0.0 + fVar96 + fVar157 + fVar87 * 0.0;
            fVar188 = fVar120 * 0.0 + fVar99 + fVar166 + fVar94 * 0.0;
            fVar189 = fVar122 * 0.0 + fVar100 + fVar168 + fVar98 * 0.0;
            fVar190 = fVar190 + fVar109 + fVar170 + fVar108 * 0.0;
            fVar101 = ((fVar96 * 3.0 - fVar88 * 3.0) + fVar157) - fVar87 * 0.0;
            fVar106 = ((fVar99 * 3.0 - fVar120 * 3.0) + fVar166) - fVar94 * 0.0;
            fVar107 = ((fVar100 * 3.0 - fVar122 * 3.0) + fVar168) - fVar98 * 0.0;
            fVar109 = ((fVar109 * 3.0 - fVar95 * fVar33 * 3.0) + fVar170) - fVar108 * 0.0;
            fVar87 = fVar86 + fVar141 + fVar139 + fVar126 * 0.0;
            fVar94 = fVar93 + fVar142 + fVar148 + fVar150 * 0.0;
            fVar98 = fVar97 + fVar159 + fVar152 + fVar154 * 0.0;
            fVar108 = ((fVar141 * 3.0 - *pfVar1 * 3.0) + fVar139) - fVar126 * 0.0;
            fVar120 = ((fVar142 * 3.0 - pfVar1[1] * 3.0) + fVar148) - fVar150 * 0.0;
            fVar122 = ((fVar159 * 3.0 - pfVar1[2] * 3.0) + fVar152) - fVar154 * 0.0;
            fVar141 = fVar140 * fVar147 - fVar149 * fVar138;
            fVar150 = fVar149 * fVar151 - fVar153 * fVar147;
            fVar154 = fVar153 * fVar138 - fVar140 * fVar151;
            fVar86 = fVar147 * fVar158 - fVar167 * fVar138;
            fVar167 = fVar151 * fVar167 - fVar169 * fVar147;
            fVar169 = fVar138 * fVar169 - fVar158 * fVar151;
            fVar88 = fVar87 * fVar106 - fVar94 * fVar101;
            fVar95 = fVar94 * fVar107 - fVar98 * fVar106;
            fVar99 = fVar98 * fVar101 - fVar87 * fVar107;
            fVar87 = fVar106 * fVar108 - fVar120 * fVar101;
            fVar98 = fVar107 * fVar120 - fVar122 * fVar106;
            fVar108 = fVar101 * fVar122 - fVar108 * fVar107;
            fVar159 = fVar154 * fVar154 + fVar150 * fVar150 + fVar141 * fVar141;
            auVar161 = ZEXT416((uint)fVar159);
            auVar112 = rsqrtss(ZEXT416((uint)fVar159),auVar161);
            fVar94 = auVar112._0_4_;
            fVar142 = fVar94 * 1.5 - fVar94 * fVar94 * fVar159 * 0.5 * fVar94;
            fVar97 = fVar141 * fVar86 + fVar154 * fVar169 + fVar150 * fVar167;
            auVar112 = rcpss(auVar161,auVar161);
            fVar158 = (2.0 - fVar159 * auVar112._0_4_) * auVar112._0_4_;
            fVar126 = fVar99 * fVar99 + fVar95 * fVar95 + fVar88 * fVar88;
            auVar112 = ZEXT416((uint)fVar126);
            auVar161 = rsqrtss(ZEXT416((uint)fVar126),auVar112);
            fVar94 = auVar161._0_4_;
            fVar120 = fVar94 * 1.5 - fVar94 * fVar94 * fVar126 * 0.5 * fVar94;
            fVar93 = fVar88 * fVar87 + fVar99 * fVar108 + fVar95 * fVar98;
            auVar112 = rcpss(auVar112,auVar112);
            fVar94 = (2.0 - fVar126 * auVar112._0_4_) * auVar112._0_4_;
            fVar122 = fVar196 * fVar150 * fVar142;
            fVar96 = fVar196 * fVar154 * fVar142;
            fVar100 = fVar196 * fVar141 * fVar142;
            fVar139 = fVar191 - fVar122;
            fVar140 = fVar194 - fVar96;
            fVar148 = fVar195 - fVar100;
            fVar150 = fVar196 * fVar158 * (fVar159 * fVar167 - fVar97 * fVar150) * fVar142 +
                      fVar156 * fVar150 * fVar142;
            fVar154 = fVar196 * fVar158 * (fVar159 * fVar169 - fVar97 * fVar154) * fVar142 +
                      fVar156 * fVar154 * fVar142;
            fVar141 = fVar196 * fVar158 * (fVar159 * fVar86 - fVar97 * fVar141) * fVar142 +
                      fVar156 * fVar141 * fVar142;
            fVar158 = fVar190 * fVar95 * fVar120;
            fVar167 = fVar190 * fVar99 * fVar120;
            fVar169 = fVar190 * fVar88 * fVar120;
            fVar142 = fVar186 - fVar158;
            fVar159 = fVar188 - fVar167;
            fVar156 = fVar189 - fVar169;
            fVar86 = fVar190 * fVar94 * (fVar126 * fVar98 - fVar93 * fVar95) * fVar120 +
                     fVar109 * fVar95 * fVar120;
            fVar108 = fVar190 * fVar94 * (fVar126 * fVar108 - fVar93 * fVar99) * fVar120 +
                      fVar109 * fVar99 * fVar120;
            fVar88 = fVar190 * fVar94 * (fVar126 * fVar87 - fVar93 * fVar88) * fVar120 +
                     fVar109 * fVar88 * fVar120;
            fVar120 = (fVar138 - fVar150) * 0.33333334 + fVar139;
            fVar95 = (fVar147 - fVar154) * 0.33333334 + fVar140;
            fVar99 = (fVar151 - fVar141) * 0.33333334 + fVar148;
            fVar87 = fVar142 - (fVar101 - fVar86) * 0.33333334;
            fVar94 = fVar159 - (fVar106 - fVar108) * 0.33333334;
            fVar98 = fVar156 - (fVar107 - fVar88) * 0.33333334;
            lVar23 = 0;
            local_318 = 0x7f800000;
            uStack_314 = 0x7f800000;
            uStack_310 = 0x7f800000;
            uStack_30c = 0x7f800000;
            local_328._8_8_ = 0x7f8000007f800000;
            local_328._0_8_ = 0x7f8000007f800000;
            local_3a8._8_8_ = 0x7f8000007f800000;
            local_3a8._0_8_ = 0x7f8000007f800000;
            local_368.m128 = _DAT_01feba00;
            local_378.m128 = _DAT_01feba00;
            aVar185 = _DAT_01feba00;
            do {
              uVar20 = (uint)lVar23;
              lVar28 = lVar23 * 4;
              fVar109 = *(float *)(bezier_basis0 + lVar28 + 0x1dc);
              fVar126 = *(float *)(bezier_basis0 + lVar28 + 0x1e0);
              fVar93 = *(float *)(bezier_basis0 + lVar28 + 0x1e4);
              fVar97 = *(float *)(bezier_basis0 + lVar28 + 0x1e8);
              lVar28 = lVar23 * 4;
              fVar149 = *(float *)(bezier_basis0 + lVar28 + 0x660);
              fVar152 = *(float *)(bezier_basis0 + lVar28 + 0x664);
              fVar153 = *(float *)(bezier_basis0 + lVar28 + 0x668);
              fVar157 = *(float *)(bezier_basis0 + lVar28 + 0x66c);
              lVar28 = lVar23 * 4;
              fVar166 = *(float *)(bezier_basis0 + lVar28 + 0xae4);
              fVar168 = *(float *)(bezier_basis0 + lVar28 + 0xae8);
              fVar170 = *(float *)(bezier_basis0 + lVar28 + 0xaec);
              fVar190 = *(float *)(bezier_basis0 + lVar28 + 0xaf0);
              lVar28 = lVar23 * 4;
              fVar196 = *(float *)(bezier_basis0 + lVar28 + 0xf68);
              fVar8 = *(float *)(bezier_basis0 + lVar28 + 0xf6c);
              fVar9 = *(float *)(bezier_basis0 + lVar28 + 0xf70);
              fVar10 = *(float *)(bezier_basis0 + lVar28 + 0xf74);
              auVar162._0_4_ =
                   fVar139 * fVar109 + fVar120 * fVar149 + fVar87 * fVar166 + fVar142 * fVar196;
              auVar162._4_4_ =
                   fVar139 * fVar126 + fVar120 * fVar152 + fVar87 * fVar168 + fVar142 * fVar8;
              auVar162._8_4_ =
                   fVar139 * fVar93 + fVar120 * fVar153 + fVar87 * fVar170 + fVar142 * fVar9;
              auVar162._12_4_ =
                   fVar139 * fVar97 + fVar120 * fVar157 + fVar87 * fVar190 + fVar142 * fVar10;
              auVar143._0_4_ =
                   fVar140 * fVar109 + fVar95 * fVar149 + fVar94 * fVar166 + fVar159 * fVar196;
              auVar143._4_4_ =
                   fVar140 * fVar126 + fVar95 * fVar152 + fVar94 * fVar168 + fVar159 * fVar8;
              auVar143._8_4_ =
                   fVar140 * fVar93 + fVar95 * fVar153 + fVar94 * fVar170 + fVar159 * fVar9;
              auVar143._12_4_ =
                   fVar140 * fVar97 + fVar95 * fVar157 + fVar94 * fVar190 + fVar159 * fVar10;
              fVar110 = fVar109 * fVar148 + fVar149 * fVar99 + fVar166 * fVar98 + fVar196 * fVar156;
              fVar121 = fVar126 * fVar148 + fVar152 * fVar99 + fVar168 * fVar98 + fVar8 * fVar156;
              fVar123 = fVar93 * fVar148 + fVar153 * fVar99 + fVar170 * fVar98 + fVar9 * fVar156;
              fVar124 = fVar97 * fVar148 + fVar157 * fVar99 + fVar190 * fVar98 + fVar10 * fVar156;
              lVar28 = lVar23 * 4;
              fVar109 = *(float *)(bezier_basis0 + lVar28 + 0x13ec);
              fVar126 = *(float *)(bezier_basis0 + lVar28 + 0x13f0);
              fVar93 = *(float *)(bezier_basis0 + lVar28 + 0x13f4);
              fVar97 = *(float *)(bezier_basis0 + lVar28 + 0x13f8);
              lVar28 = lVar23 * 4;
              fVar149 = *(float *)(bezier_basis0 + lVar28 + 0x1870);
              fVar152 = *(float *)(bezier_basis0 + lVar28 + 0x1874);
              fVar153 = *(float *)(bezier_basis0 + lVar28 + 0x1878);
              fVar157 = *(float *)(bezier_basis0 + lVar28 + 0x187c);
              lVar28 = lVar23 * 4;
              fVar166 = *(float *)(bezier_basis0 + lVar28 + 0x1cf4);
              fVar168 = *(float *)(bezier_basis0 + lVar28 + 0x1cf8);
              fVar170 = *(float *)(bezier_basis0 + lVar28 + 0x1cfc);
              fVar190 = *(float *)(bezier_basis0 + lVar28 + 0x1d00);
              lVar28 = lVar23 * 4;
              fVar196 = *(float *)(bezier_basis0 + lVar28 + 0x2178);
              fVar8 = *(float *)(bezier_basis0 + lVar28 + 0x217c);
              fVar9 = *(float *)(bezier_basis0 + lVar28 + 0x2180);
              fVar10 = *(float *)(bezier_basis0 + lVar28 + 0x2184);
              fVar59 = fVar139 * fVar109 + fVar120 * fVar149 + fVar87 * fVar166 + fVar142 * fVar196;
              fVar70 = fVar139 * fVar126 + fVar120 * fVar152 + fVar87 * fVar168 + fVar142 * fVar8;
              fVar71 = fVar139 * fVar93 + fVar120 * fVar153 + fVar87 * fVar170 + fVar142 * fVar9;
              fVar72 = fVar139 * fVar97 + fVar120 * fVar157 + fVar87 * fVar190 + fVar142 * fVar10;
              fVar171 = fVar140 * fVar109 + fVar95 * fVar149 + fVar94 * fVar166 + fVar159 * fVar196;
              fVar173 = fVar140 * fVar126 + fVar95 * fVar152 + fVar94 * fVar168 + fVar159 * fVar8;
              fVar174 = fVar140 * fVar93 + fVar95 * fVar153 + fVar94 * fVar170 + fVar159 * fVar9;
              fVar175 = fVar140 * fVar97 + fVar95 * fVar157 + fVar94 * fVar190 + fVar159 * fVar10;
              fVar109 = fVar109 * fVar148 + fVar149 * fVar99 + fVar166 * fVar98 + fVar196 * fVar156;
              fVar126 = fVar126 * fVar148 + fVar152 * fVar99 + fVar168 * fVar98 + fVar8 * fVar156;
              fVar93 = fVar93 * fVar148 + fVar153 * fVar99 + fVar170 * fVar98 + fVar9 * fVar156;
              fVar97 = fVar97 * fVar148 + fVar157 * fVar99 + fVar190 * fVar98 + fVar10 * fVar156;
              uVar127 = -(uint)(uVar20 == 0);
              uVar133 = -(uint)(uVar20 == 1);
              uVar135 = -(uint)(uVar20 == 2);
              uVar137 = -(uint)(uVar20 == 3);
              uVar176 = -(uint)(uVar20 == 7);
              uVar179 = -(uint)(uVar20 == 6);
              uVar180 = -(uint)(uVar20 == 5);
              uVar181 = -(uint)(uVar20 == 4);
              auVar183 = minps(local_3a8,auVar162);
              auVar74 = maxps((undefined1  [16])local_378,auVar162);
              auVar163._0_8_ =
                   CONCAT44(auVar162._4_4_ - (float)(~uVar133 & (uint)fVar70) * 0.055555556,
                            auVar162._0_4_ - (float)(~uVar127 & (uint)fVar59) * 0.055555556);
              auVar163._8_4_ = auVar162._8_4_ - (float)(~uVar135 & (uint)fVar71) * 0.055555556;
              auVar163._12_4_ = auVar162._12_4_ - (float)(~uVar137 & (uint)fVar72) * 0.055555556;
              auVar192._0_4_ = (float)(~uVar176 & (uint)fVar171) * 0.055555556 + auVar143._0_4_;
              auVar192._4_4_ = (float)(~uVar179 & (uint)fVar173) * 0.055555556 + auVar143._4_4_;
              auVar192._8_4_ = (float)(~uVar180 & (uint)fVar174) * 0.055555556 + auVar143._8_4_;
              auVar192._12_4_ = (float)(~uVar181 & (uint)fVar175) * 0.055555556 + auVar143._12_4_;
              auVar102 = minps(local_328,auVar143);
              auVar187 = maxps((undefined1  [16])local_368,auVar143);
              auVar144._0_8_ =
                   CONCAT44(auVar143._4_4_ - (float)(~uVar133 & (uint)fVar173) * 0.055555556,
                            auVar143._0_4_ - (float)(~uVar127 & (uint)fVar171) * 0.055555556);
              auVar144._8_4_ = auVar143._8_4_ - (float)(~uVar135 & (uint)fVar174) * 0.055555556;
              auVar144._12_4_ = auVar143._12_4_ - (float)(~uVar137 & (uint)fVar175) * 0.055555556;
              auVar75._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar75._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar75._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar75._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar16._4_4_ = fVar121;
              auVar16._0_4_ = fVar110;
              auVar16._8_4_ = fVar123;
              auVar16._12_4_ = fVar124;
              auVar177._0_4_ = (float)(~uVar176 & (uint)fVar109) * 0.055555556 + fVar110;
              auVar177._4_4_ = (float)(~uVar179 & (uint)fVar126) * 0.055555556 + fVar121;
              auVar177._8_4_ = (float)(~uVar180 & (uint)fVar93) * 0.055555556 + fVar123;
              auVar177._12_4_ = (float)(~uVar181 & (uint)fVar97) * 0.055555556 + fVar124;
              auVar178._4_4_ = uStack_314;
              auVar178._0_4_ = local_318;
              auVar178._8_4_ = uStack_310;
              auVar178._12_4_ = uStack_30c;
              auVar61 = minps(auVar178,auVar16);
              auVar112 = maxps((undefined1  [16])aVar185,auVar16);
              auVar113._0_8_ =
                   CONCAT44(fVar121 - (float)(~uVar133 & (uint)fVar126) * 0.055555556,
                            fVar110 - (float)(~uVar127 & (uint)fVar109) * 0.055555556);
              auVar113._8_4_ = fVar123 - (float)(~uVar135 & (uint)fVar93) * 0.055555556;
              auVar113._12_4_ = fVar124 - (float)(~uVar137 & (uint)fVar97) * 0.055555556;
              auVar37._8_4_ = auVar163._8_4_;
              auVar37._0_8_ = auVar163._0_8_;
              auVar37._12_4_ = auVar163._12_4_;
              auVar182._4_4_ = (float)(~uVar179 & (uint)fVar70) * 0.055555556 + auVar162._4_4_;
              auVar182._0_4_ = (float)(~uVar176 & (uint)fVar59) * 0.055555556 + auVar162._0_4_;
              auVar182._8_4_ = (float)(~uVar180 & (uint)fVar71) * 0.055555556 + auVar162._8_4_;
              auVar182._12_4_ = (float)(~uVar181 & (uint)fVar72) * 0.055555556 + auVar162._12_4_;
              auVar161 = minps(auVar37,auVar182);
              auVar183 = minps(auVar183,auVar161);
              auVar38._8_4_ = auVar144._8_4_;
              auVar38._0_8_ = auVar144._0_8_;
              auVar38._12_4_ = auVar144._12_4_;
              auVar161 = minps(auVar38,auVar192);
              auVar102 = minps(auVar102,auVar161);
              auVar39._8_4_ = auVar113._8_4_;
              auVar39._0_8_ = auVar113._0_8_;
              auVar39._12_4_ = auVar113._12_4_;
              auVar161 = minps(auVar39,auVar177);
              auVar161 = minps(auVar61,auVar161);
              local_3a8 = local_3a8 & auVar75 | ~auVar75 & auVar183;
              auVar83._0_4_ = local_328._0_4_ & auVar75._0_4_;
              auVar83._4_4_ = local_328._4_4_ & auVar75._4_4_;
              auVar83._8_4_ = local_328._8_4_ & auVar75._8_4_;
              auVar83._12_4_ = local_328._12_4_ & auVar75._12_4_;
              local_328 = auVar83 | ~auVar75 & auVar102;
              local_318 = local_318 & auVar75._0_4_ | ~auVar75._0_4_ & auVar161._0_4_;
              uStack_314 = uStack_314 & auVar75._4_4_ | ~auVar75._4_4_ & auVar161._4_4_;
              uStack_310 = uStack_310 & auVar75._8_4_ | ~auVar75._8_4_ & auVar161._8_4_;
              uStack_30c = uStack_30c & auVar75._12_4_ | ~auVar75._12_4_ & auVar161._12_4_;
              auVar161 = maxps(auVar163,auVar182);
              auVar161 = maxps(auVar74,auVar161);
              auVar61 = maxps(auVar144,auVar192);
              auVar74 = maxps(auVar187,auVar61);
              auVar61 = maxps(auVar113,auVar177);
              auVar112 = maxps(auVar112,auVar61);
              uVar135 = (uint)local_378.m128[0] & auVar75._0_4_ | ~auVar75._0_4_ & auVar161._0_4_;
              uVar137 = (uint)local_378.m128[1] & auVar75._4_4_ | ~auVar75._4_4_ & auVar161._4_4_;
              uVar176 = (uint)local_378.m128[2] & auVar75._8_4_ | ~auVar75._8_4_ & auVar161._8_4_;
              local_378.m128[3] =
                   (float)((uint)local_378.m128[3] & auVar75._12_4_ |
                          ~auVar75._12_4_ & auVar161._12_4_);
              local_378.m128[1] = (float)uVar137;
              local_378.m128[0] = (float)uVar135;
              local_378.m128[2] = (float)uVar176;
              uVar20 = (uint)local_368.m128[0] & auVar75._0_4_ | ~auVar75._0_4_ & auVar74._0_4_;
              uVar127 = (uint)local_368.m128[1] & auVar75._4_4_ | ~auVar75._4_4_ & auVar74._4_4_;
              uVar133 = (uint)local_368.m128[2] & auVar75._8_4_ | ~auVar75._8_4_ & auVar74._8_4_;
              local_368.m128[3] =
                   (float)((uint)local_368.m128[3] & auVar75._12_4_ |
                          ~auVar75._12_4_ & auVar74._12_4_);
              local_368.m128[1] = (float)uVar127;
              local_368.m128[0] = (float)uVar20;
              local_368.m128[2] = (float)uVar133;
              local_388 = aVar185.m128[0];
              fStack_384 = aVar185.m128[1];
              fStack_380 = aVar185.m128[2];
              fStack_37c = aVar185.m128[3];
              auVar40._0_4_ = (uint)local_388 & auVar75._0_4_;
              auVar40._4_4_ = (uint)fStack_384 & auVar75._4_4_;
              auVar40._8_4_ = (uint)fStack_380 & auVar75._8_4_;
              auVar40._12_4_ = (uint)fStack_37c & auVar75._12_4_;
              auVar184._4_4_ = ~auVar75._4_4_ & auVar112._4_4_;
              auVar184._0_4_ = ~auVar75._0_4_ & auVar112._0_4_;
              auVar184._8_4_ = ~auVar75._8_4_ & auVar112._8_4_;
              auVar184._12_4_ = ~auVar75._12_4_ & auVar112._12_4_;
              aVar185 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar184 | auVar40);
              lVar23 = lVar23 + 4;
            } while (lVar23 == 4);
            fVar191 = fVar191 + fVar122;
            fVar194 = fVar194 + fVar96;
            fVar195 = fVar195 + fVar100;
            fVar186 = fVar186 + fVar158;
            fVar188 = fVar188 + fVar167;
            fVar189 = fVar189 + fVar169;
            fVar158 = (fVar150 + fVar138) * 0.33333334 + fVar191;
            fVar167 = (fVar154 + fVar147) * 0.33333334 + fVar194;
            fVar169 = (fVar141 + fVar151) * 0.33333334 + fVar195;
            fVar87 = fVar186 - (fVar86 + fVar101) * 0.33333334;
            fVar94 = fVar188 - (fVar108 + fVar106) * 0.33333334;
            fVar98 = fVar189 - (fVar88 + fVar107) * 0.33333334;
            auVar41._4_4_ = local_3a8._0_4_;
            auVar41._0_4_ = local_3a8._4_4_;
            auVar41._8_4_ = local_3a8._12_4_;
            auVar41._12_4_ = local_3a8._8_4_;
            auVar112 = minps(auVar41,local_3a8);
            auVar62._0_8_ = auVar112._8_8_;
            auVar62._8_4_ = auVar112._0_4_;
            auVar62._12_4_ = auVar112._4_4_;
            auVar161 = minps(auVar62,auVar112);
            auVar42._4_4_ = local_328._0_4_;
            auVar42._0_4_ = local_328._4_4_;
            auVar42._8_4_ = local_328._12_4_;
            auVar42._12_4_ = local_328._8_4_;
            auVar112 = minps(auVar42,local_328);
            auVar76._0_8_ = auVar112._8_8_;
            auVar76._8_4_ = auVar112._0_4_;
            auVar76._12_4_ = auVar112._4_4_;
            auVar61 = minps(auVar76,auVar112);
            auVar11._4_4_ = uStack_314;
            auVar11._0_4_ = local_318;
            auVar11._8_4_ = uStack_310;
            auVar11._12_4_ = uStack_30c;
            auVar43._4_4_ = local_318;
            auVar43._0_4_ = uStack_314;
            auVar43._8_4_ = uStack_30c;
            auVar43._12_4_ = uStack_310;
            auVar112 = minps(auVar43,auVar11);
            auVar44._0_8_ = auVar112._8_8_;
            auVar44._8_4_ = auVar112._0_4_;
            auVar44._12_4_ = auVar112._4_4_;
            auVar85._4_4_ = auVar61._0_4_;
            auVar85._0_4_ = auVar161._0_4_;
            auVar45._4_4_ = uVar135;
            auVar45._0_4_ = uVar137;
            auVar45._8_4_ = local_378.m128[3];
            auVar45._12_4_ = uVar176;
            auVar161 = maxps(auVar45,(undefined1  [16])local_378);
            auVar63._0_8_ = auVar161._8_8_;
            auVar63._8_4_ = auVar161._0_4_;
            auVar63._12_4_ = auVar161._4_4_;
            auVar61 = maxps(auVar63,auVar161);
            auVar46._4_4_ = uVar20;
            auVar46._0_4_ = uVar127;
            auVar46._8_4_ = local_368.m128[3];
            auVar46._12_4_ = uVar133;
            auVar161 = maxps(auVar46,(undefined1  [16])local_368);
            auVar77._0_8_ = auVar161._8_8_;
            auVar77._8_4_ = auVar161._0_4_;
            auVar77._12_4_ = auVar161._4_4_;
            auVar74 = maxps(auVar77,auVar161);
            auVar47._4_4_ = aVar185.m128[0];
            auVar47._0_4_ = aVar185.m128[1];
            auVar47._8_4_ = aVar185.m128[3];
            auVar47._12_4_ = aVar185.m128[2];
            auVar161 = maxps(auVar47,(undefined1  [16])aVar185);
            auVar48._0_8_ = auVar161._8_8_;
            auVar48._8_4_ = auVar161._0_4_;
            auVar48._12_4_ = auVar161._4_4_;
            auVar90._4_4_ = auVar74._0_4_;
            auVar90._0_4_ = auVar61._0_4_;
            lVar23 = 0;
            local_318 = 0x7f800000;
            uStack_314 = 0x7f800000;
            uStack_310 = 0x7f800000;
            uStack_30c = 0x7f800000;
            local_328._8_8_ = 0x7f8000007f800000;
            local_328._0_8_ = 0x7f8000007f800000;
            local_3a8._8_8_ = 0x7f8000007f800000;
            local_3a8._0_8_ = 0x7f8000007f800000;
            local_368.m128 = _DAT_01feba00;
            local_378.m128 = _DAT_01feba00;
            aVar185 = _DAT_01feba00;
            do {
              uVar20 = (uint)lVar23;
              lVar28 = lVar23 * 4;
              fVar108 = *(float *)(bezier_basis0 + lVar28 + 0x1dc);
              fVar86 = *(float *)(bezier_basis0 + lVar28 + 0x1e0);
              fVar88 = *(float *)(bezier_basis0 + lVar28 + 0x1e4);
              fVar120 = *(float *)(bezier_basis0 + lVar28 + 0x1e8);
              lVar28 = lVar23 * 4;
              fVar122 = *(float *)(bezier_basis0 + lVar28 + 0x660);
              fVar95 = *(float *)(bezier_basis0 + lVar28 + 0x664);
              fVar96 = *(float *)(bezier_basis0 + lVar28 + 0x668);
              fVar99 = *(float *)(bezier_basis0 + lVar28 + 0x66c);
              lVar28 = lVar23 * 4;
              fVar100 = *(float *)(bezier_basis0 + lVar28 + 0xae4);
              fVar109 = *(float *)(bezier_basis0 + lVar28 + 0xae8);
              fVar126 = *(float *)(bezier_basis0 + lVar28 + 0xaec);
              fVar150 = *(float *)(bezier_basis0 + lVar28 + 0xaf0);
              lVar28 = lVar23 * 4;
              fVar154 = *(float *)(bezier_basis0 + lVar28 + 0xf68);
              fVar101 = *(float *)(bezier_basis0 + lVar28 + 0xf6c);
              fVar106 = *(float *)(bezier_basis0 + lVar28 + 0xf70);
              fVar107 = *(float *)(bezier_basis0 + lVar28 + 0xf74);
              auVar49._0_4_ =
                   fVar191 * fVar108 + fVar158 * fVar122 + fVar87 * fVar100 + fVar186 * fVar154;
              auVar49._4_4_ =
                   fVar191 * fVar86 + fVar158 * fVar95 + fVar87 * fVar109 + fVar186 * fVar101;
              auVar49._8_4_ =
                   fVar191 * fVar88 + fVar158 * fVar96 + fVar87 * fVar126 + fVar186 * fVar106;
              auVar49._12_4_ =
                   fVar191 * fVar120 + fVar158 * fVar99 + fVar87 * fVar150 + fVar186 * fVar107;
              auVar84._0_4_ =
                   fVar194 * fVar108 + fVar167 * fVar122 + fVar94 * fVar100 + fVar188 * fVar154;
              auVar84._4_4_ =
                   fVar194 * fVar86 + fVar167 * fVar95 + fVar94 * fVar109 + fVar188 * fVar101;
              auVar84._8_4_ =
                   fVar194 * fVar88 + fVar167 * fVar96 + fVar94 * fVar126 + fVar188 * fVar106;
              auVar84._12_4_ =
                   fVar194 * fVar120 + fVar167 * fVar99 + fVar94 * fVar150 + fVar188 * fVar107;
              fVar141 = fVar108 * fVar195 + fVar122 * fVar169 + fVar100 * fVar98 + fVar154 * fVar189
              ;
              fVar142 = fVar86 * fVar195 + fVar95 * fVar169 + fVar109 * fVar98 + fVar101 * fVar189;
              fVar159 = fVar88 * fVar195 + fVar96 * fVar169 + fVar126 * fVar98 + fVar106 * fVar189;
              fVar138 = fVar120 * fVar195 + fVar99 * fVar169 + fVar150 * fVar98 + fVar107 * fVar189;
              lVar28 = lVar23 * 4;
              fVar108 = *(float *)(bezier_basis0 + lVar28 + 0x13ec);
              fVar86 = *(float *)(bezier_basis0 + lVar28 + 0x13f0);
              fVar88 = *(float *)(bezier_basis0 + lVar28 + 0x13f4);
              fVar120 = *(float *)(bezier_basis0 + lVar28 + 0x13f8);
              lVar28 = lVar23 * 4;
              fVar122 = *(float *)(bezier_basis0 + lVar28 + 0x1870);
              fVar95 = *(float *)(bezier_basis0 + lVar28 + 0x1874);
              fVar96 = *(float *)(bezier_basis0 + lVar28 + 0x1878);
              fVar99 = *(float *)(bezier_basis0 + lVar28 + 0x187c);
              lVar28 = lVar23 * 4;
              fVar100 = *(float *)(bezier_basis0 + lVar28 + 0x1cf4);
              fVar109 = *(float *)(bezier_basis0 + lVar28 + 0x1cf8);
              fVar126 = *(float *)(bezier_basis0 + lVar28 + 0x1cfc);
              fVar150 = *(float *)(bezier_basis0 + lVar28 + 0x1d00);
              lVar28 = lVar23 * 4;
              fVar154 = *(float *)(bezier_basis0 + lVar28 + 0x2178);
              fVar101 = *(float *)(bezier_basis0 + lVar28 + 0x217c);
              fVar106 = *(float *)(bezier_basis0 + lVar28 + 0x2180);
              fVar107 = *(float *)(bezier_basis0 + lVar28 + 0x2184);
              fVar147 = fVar191 * fVar108 + fVar158 * fVar122 + fVar87 * fVar100 + fVar186 * fVar154
              ;
              fVar151 = fVar191 * fVar86 + fVar158 * fVar95 + fVar87 * fVar109 + fVar186 * fVar101;
              fVar156 = fVar191 * fVar88 + fVar158 * fVar96 + fVar87 * fVar126 + fVar186 * fVar106;
              fVar93 = fVar191 * fVar120 + fVar158 * fVar99 + fVar87 * fVar150 + fVar186 * fVar107;
              fVar97 = fVar194 * fVar108 + fVar167 * fVar122 + fVar94 * fVar100 + fVar188 * fVar154;
              fVar139 = fVar194 * fVar86 + fVar167 * fVar95 + fVar94 * fVar109 + fVar188 * fVar101;
              fVar140 = fVar194 * fVar88 + fVar167 * fVar96 + fVar94 * fVar126 + fVar188 * fVar106;
              fVar148 = fVar194 * fVar120 + fVar167 * fVar99 + fVar94 * fVar150 + fVar188 * fVar107;
              fVar108 = fVar108 * fVar195 + fVar122 * fVar169 + fVar100 * fVar98 + fVar154 * fVar189
              ;
              fVar86 = fVar86 * fVar195 + fVar95 * fVar169 + fVar109 * fVar98 + fVar101 * fVar189;
              fVar88 = fVar88 * fVar195 + fVar96 * fVar169 + fVar126 * fVar98 + fVar106 * fVar189;
              fVar120 = fVar120 * fVar195 + fVar99 * fVar169 + fVar150 * fVar98 + fVar107 * fVar189;
              uVar127 = -(uint)(uVar20 == 0);
              uVar133 = -(uint)(uVar20 == 1);
              uVar135 = -(uint)(uVar20 == 2);
              uVar137 = -(uint)(uVar20 == 3);
              uVar176 = -(uint)(uVar20 == 7);
              uVar179 = -(uint)(uVar20 == 6);
              uVar180 = -(uint)(uVar20 == 5);
              uVar181 = -(uint)(uVar20 == 4);
              auVar182 = minps(local_3a8,auVar49);
              auVar183 = maxps((undefined1  [16])local_378,auVar49);
              auVar145._0_8_ =
                   CONCAT44(auVar49._4_4_ - (float)(~uVar133 & (uint)fVar151) * 0.055555556,
                            auVar49._0_4_ - (float)(~uVar127 & (uint)fVar147) * 0.055555556);
              auVar145._8_4_ = auVar49._8_4_ - (float)(~uVar135 & (uint)fVar156) * 0.055555556;
              auVar145._12_4_ = auVar49._12_4_ - (float)(~uVar137 & (uint)fVar93) * 0.055555556;
              auVar103._0_4_ = (float)(~uVar176 & (uint)fVar97) * 0.055555556 + auVar84._0_4_;
              auVar103._4_4_ = (float)(~uVar179 & (uint)fVar139) * 0.055555556 + auVar84._4_4_;
              auVar103._8_4_ = (float)(~uVar180 & (uint)fVar140) * 0.055555556 + auVar84._8_4_;
              auVar103._12_4_ = (float)(~uVar181 & (uint)fVar148) * 0.055555556 + auVar84._12_4_;
              auVar102 = minps(local_328,auVar84);
              auVar178 = maxps((undefined1  [16])local_368,auVar84);
              auVar89._0_8_ =
                   CONCAT44(auVar84._4_4_ - (float)(~uVar133 & (uint)fVar139) * 0.055555556,
                            auVar84._0_4_ - (float)(~uVar127 & (uint)fVar97) * 0.055555556);
              auVar89._8_4_ = auVar84._8_4_ - (float)(~uVar135 & (uint)fVar140) * 0.055555556;
              auVar89._12_4_ = auVar84._12_4_ - (float)(~uVar137 & (uint)fVar148) * 0.055555556;
              auVar164._0_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar164._4_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar164._8_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar164._12_4_ = -(uint)(-0x7ffffff9 < (int)(uVar20 ^ 0x80000000));
              auVar15._4_4_ = fVar142;
              auVar15._0_4_ = fVar141;
              auVar15._8_4_ = fVar159;
              auVar15._12_4_ = fVar138;
              auVar172._0_4_ = (float)(~uVar176 & (uint)fVar108) * 0.055555556 + fVar141;
              auVar172._4_4_ = (float)(~uVar179 & (uint)fVar86) * 0.055555556 + fVar142;
              auVar172._8_4_ = (float)(~uVar180 & (uint)fVar88) * 0.055555556 + fVar159;
              auVar172._12_4_ = (float)(~uVar181 & (uint)fVar120) * 0.055555556 + fVar138;
              auVar12._4_4_ = uStack_314;
              auVar12._0_4_ = local_318;
              auVar12._8_4_ = uStack_310;
              auVar12._12_4_ = uStack_30c;
              auVar61 = minps(auVar12,auVar15);
              auVar74 = maxps((undefined1  [16])aVar185,auVar15);
              auVar193._0_8_ =
                   CONCAT44(fVar142 - (float)(~uVar133 & (uint)fVar86) * 0.055555556,
                            fVar141 - (float)(~uVar127 & (uint)fVar108) * 0.055555556);
              auVar193._8_4_ = fVar159 - (float)(~uVar135 & (uint)fVar88) * 0.055555556;
              auVar193._12_4_ = fVar138 - (float)(~uVar137 & (uint)fVar120) * 0.055555556;
              auVar114._8_4_ = auVar145._8_4_;
              auVar114._0_8_ = auVar145._0_8_;
              auVar114._12_4_ = auVar145._12_4_;
              auVar14._4_4_ = (float)(~uVar179 & (uint)fVar151) * 0.055555556 + auVar49._4_4_;
              auVar14._0_4_ = (float)(~uVar176 & (uint)fVar147) * 0.055555556 + auVar49._0_4_;
              auVar14._8_4_ = (float)(~uVar180 & (uint)fVar156) * 0.055555556 + auVar49._8_4_;
              auVar14._12_4_ = (float)(~uVar181 & (uint)fVar93) * 0.055555556 + auVar49._12_4_;
              auVar187 = minps(auVar114,auVar14);
              auVar182 = minps(auVar182,auVar187);
              auVar115._8_4_ = auVar89._8_4_;
              auVar115._0_8_ = auVar89._0_8_;
              auVar115._12_4_ = auVar89._12_4_;
              auVar187 = minps(auVar115,auVar103);
              auVar102 = minps(auVar102,auVar187);
              auVar116._8_4_ = auVar193._8_4_;
              auVar116._0_8_ = auVar193._0_8_;
              auVar116._12_4_ = auVar193._12_4_;
              auVar187 = minps(auVar116,auVar172);
              auVar61 = minps(auVar61,auVar187);
              local_3a8 = local_3a8 & auVar164 | ~auVar164 & auVar182;
              auVar129._0_4_ = local_328._0_4_ & auVar164._0_4_;
              auVar129._4_4_ = local_328._4_4_ & auVar164._4_4_;
              auVar129._8_4_ = local_328._8_4_ & auVar164._8_4_;
              auVar129._12_4_ = local_328._12_4_ & auVar164._12_4_;
              local_328 = auVar129 | ~auVar164 & auVar102;
              local_318 = local_318 & auVar164._0_4_ | ~auVar164._0_4_ & auVar61._0_4_;
              uStack_314 = uStack_314 & auVar164._4_4_ | ~auVar164._4_4_ & auVar61._4_4_;
              uStack_310 = uStack_310 & auVar164._8_4_ | ~auVar164._8_4_ & auVar61._8_4_;
              uStack_30c = uStack_30c & auVar164._12_4_ | ~auVar164._12_4_ & auVar61._12_4_;
              auVar61 = maxps(auVar145,auVar14);
              auVar102 = maxps(auVar183,auVar61);
              auVar61 = maxps(auVar89,auVar103);
              auVar183 = maxps(auVar178,auVar61);
              auVar61 = maxps(auVar193,auVar172);
              auVar61 = maxps(auVar74,auVar61);
              uVar20 = (uint)local_378.m128[0] & auVar164._0_4_ | ~auVar164._0_4_ & auVar102._0_4_;
              uVar127 = (uint)local_378.m128[1] & auVar164._4_4_ | ~auVar164._4_4_ & auVar102._4_4_;
              uVar133 = (uint)local_378.m128[2] & auVar164._8_4_ | ~auVar164._8_4_ & auVar102._8_4_;
              local_378.m128[3] =
                   (float)((uint)local_378.m128[3] & auVar164._12_4_ |
                          ~auVar164._12_4_ & auVar102._12_4_);
              local_378.m128[1] = (float)uVar127;
              local_378.m128[0] = (float)uVar20;
              local_378.m128[2] = (float)uVar133;
              uVar135 = (uint)local_368.m128[0] & auVar164._0_4_ | ~auVar164._0_4_ & auVar183._0_4_;
              uVar137 = (uint)local_368.m128[1] & auVar164._4_4_ | ~auVar164._4_4_ & auVar183._4_4_;
              uVar176 = (uint)local_368.m128[2] & auVar164._8_4_ | ~auVar164._8_4_ & auVar183._8_4_;
              local_368.m128[3] =
                   (float)((uint)local_368.m128[3] & auVar164._12_4_ |
                          ~auVar164._12_4_ & auVar183._12_4_);
              local_368.m128[1] = (float)uVar137;
              local_368.m128[0] = (float)uVar135;
              local_368.m128[2] = (float)uVar176;
              local_388 = aVar185.m128[0];
              fStack_384 = aVar185.m128[1];
              fStack_380 = aVar185.m128[2];
              fStack_37c = aVar185.m128[3];
              auVar50._0_4_ = (uint)local_388 & auVar164._0_4_;
              auVar50._4_4_ = (uint)fStack_384 & auVar164._4_4_;
              auVar50._8_4_ = (uint)fStack_380 & auVar164._8_4_;
              auVar50._12_4_ = (uint)fStack_37c & auVar164._12_4_;
              auVar165._0_4_ = ~auVar164._0_4_ & auVar61._0_4_;
              auVar165._4_4_ = ~auVar164._4_4_ & auVar61._4_4_;
              auVar165._8_4_ = ~auVar164._8_4_ & auVar61._8_4_;
              auVar165._12_4_ = ~auVar164._12_4_ & auVar61._12_4_;
              aVar185 = (anon_union_16_2_47237d3f_for_Vec3fa_0)(auVar165 | auVar50);
              lVar23 = lVar23 + 4;
            } while (lVar23 == 4);
            auVar112 = minps(auVar44,auVar112);
            auVar85._8_4_ = auVar112._0_4_;
            auVar85._12_4_ = 0;
            auVar112 = maxps(auVar48,auVar161);
            auVar90._8_4_ = auVar112._0_4_;
            auVar90._12_4_ = 0;
            auVar51._4_4_ = local_3a8._0_4_;
            auVar51._0_4_ = local_3a8._4_4_;
            auVar51._8_4_ = local_3a8._12_4_;
            auVar51._12_4_ = local_3a8._8_4_;
            auVar112 = minps(auVar51,local_3a8);
            auVar64._0_8_ = auVar112._8_8_;
            auVar64._8_4_ = auVar112._0_4_;
            auVar64._12_4_ = auVar112._4_4_;
            auVar161 = minps(auVar64,auVar112);
            auVar52._4_4_ = local_328._0_4_;
            auVar52._0_4_ = local_328._4_4_;
            auVar52._8_4_ = local_328._12_4_;
            auVar52._12_4_ = local_328._8_4_;
            auVar112 = minps(auVar52,local_328);
            auVar78._0_8_ = auVar112._8_8_;
            auVar78._8_4_ = auVar112._0_4_;
            auVar78._12_4_ = auVar112._4_4_;
            auVar61 = minps(auVar78,auVar112);
            auVar13._4_4_ = uStack_314;
            auVar13._0_4_ = local_318;
            auVar13._8_4_ = uStack_310;
            auVar13._12_4_ = uStack_30c;
            auVar53._4_4_ = local_318;
            auVar53._0_4_ = uStack_314;
            auVar53._8_4_ = uStack_30c;
            auVar53._12_4_ = uStack_310;
            auVar112 = minps(auVar53,auVar13);
            auVar65._0_8_ = auVar112._8_8_;
            auVar65._8_4_ = auVar112._0_4_;
            auVar65._12_4_ = auVar112._4_4_;
            auVar112 = minps(auVar65,auVar112);
            auVar79._4_4_ = auVar61._0_4_;
            auVar79._0_4_ = auVar161._0_4_;
            auVar79._8_4_ = auVar112._0_4_;
            auVar79._12_4_ = 0;
            auVar74 = minps(auVar85,auVar79);
            auVar54._4_4_ = uVar20;
            auVar54._0_4_ = uVar127;
            auVar54._8_4_ = local_378.m128[3];
            auVar54._12_4_ = uVar133;
            auVar112 = maxps(auVar54,(undefined1  [16])local_378);
            auVar66._0_8_ = auVar112._8_8_;
            auVar66._8_4_ = auVar112._0_4_;
            auVar66._12_4_ = auVar112._4_4_;
            auVar161 = maxps(auVar66,auVar112);
            auVar55._4_4_ = uVar135;
            auVar55._0_4_ = uVar137;
            auVar55._8_4_ = local_368.m128[3];
            auVar55._12_4_ = uVar176;
            auVar112 = maxps(auVar55,(undefined1  [16])local_368);
            auVar80._0_8_ = auVar112._8_8_;
            auVar80._8_4_ = auVar112._0_4_;
            auVar80._12_4_ = auVar112._4_4_;
            auVar61 = maxps(auVar80,auVar112);
            auVar56._4_4_ = aVar185.m128[0];
            auVar56._0_4_ = aVar185.m128[1];
            auVar56._8_4_ = aVar185.m128[3];
            auVar56._12_4_ = aVar185.m128[2];
            auVar112 = maxps(auVar56,(undefined1  [16])aVar185);
            auVar67._0_8_ = auVar112._8_8_;
            auVar67._8_4_ = auVar112._0_4_;
            auVar67._12_4_ = auVar112._4_4_;
            auVar112 = maxps(auVar67,auVar112);
            auVar81._4_4_ = auVar61._0_4_;
            auVar81._0_4_ = auVar161._0_4_;
            auVar81._8_4_ = auVar112._0_4_;
            auVar81._12_4_ = 0;
            auVar112 = maxps(auVar90,auVar81);
            auVar91._0_4_ = -(uint)(auVar112._0_4_ < fVar32 && fVar125 < auVar74._0_4_);
            auVar91._4_4_ = -(uint)(auVar112._4_4_ < fVar73 && fVar132 < auVar74._4_4_);
            auVar91._8_4_ = -(uint)(auVar112._8_4_ < fVar160 && fVar134 < auVar74._8_4_);
            auVar91._12_4_ = -(uint)(auVar112._12_4_ < fVar155 && fVar136 < auVar74._12_4_);
            uVar25 = movmskps((int)lVar19,auVar91);
            if ((~(byte)uVar25 & 7) != 0) goto LAB_00a6d906;
            uVar21 = uVar21 + 1;
            bVar31 = (ulong)(long)(int)uVar22 < uVar21;
          } while (uVar21 <= (ulong)(long)(int)uVar22);
        }
        local_f0.primID = &local_e0;
        fVar33 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.lower;
        fVar32 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 super_Geometry.time_range.upper - fVar33;
        fVar73 = (fVar35 - fVar33) / fVar32;
        fVar32 = (fVar34 - fVar33) / fVar32;
        fVar34 = fVar17 * fVar73;
        fVar160 = fVar17 * fVar32;
        local_f0.this = this;
        local_e0 = uVar30;
        fVar35 = floorf(fVar34);
        fVar33 = ceilf(fVar160);
        uVar27 = (uint)fVar35;
        if (fVar35 <= 0.0) {
          fVar35 = 0.0;
        }
        fVar155 = fVar33;
        if (fVar17 <= fVar33) {
          fVar155 = fVar17;
        }
        if ((int)uVar27 < 0) {
          uVar27 = 0xffffffff;
        }
        iVar24 = (int)fVar17 + 1;
        if ((int)fVar33 < (int)fVar17 + 1) {
          iVar24 = (int)fVar33;
        }
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_b8.field_1,&local_f0,(long)(int)fVar35);
        linearBounds::anon_class_16_2_07cfa4d6::operator()
                  ((BBox3fa *)&local_d8.field_1,&local_f0,(long)(int)fVar155);
        if (iVar24 - uVar27 == 1) {
          fVar17 = fVar34 - fVar35;
          if (fVar34 - fVar35 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar35 = 1.0 - fVar17;
          auVar128._0_4_ = fVar35 * local_b8.m128[0] + fVar17 * local_d8.m128[0];
          auVar128._4_4_ = fVar35 * local_b8.m128[1] + fVar17 * local_d8.m128[1];
          auVar128._8_4_ = fVar35 * local_b8.m128[2] + fVar17 * local_d8.m128[2];
          auVar111._0_4_ = fVar35 * local_a8 + fVar17 * local_c8;
          auVar111._4_4_ = fVar35 * fStack_a4 + fVar17 * fStack_c4;
          auVar111._8_4_ = fVar35 * fStack_a0 + fVar17 * fStack_c0;
          fVar17 = fVar155 - fVar160;
          if (fVar155 - fVar160 <= 0.0) {
            fVar17 = 0.0;
          }
          fVar35 = 1.0 - fVar17;
          auVar36._0_4_ = local_d8.m128[0] * fVar35 + local_b8.m128[0] * fVar17;
          auVar36._4_4_ = local_d8.m128[1] * fVar35 + local_b8.m128[1] * fVar17;
          auVar36._8_4_ = local_d8.m128[2] * fVar35 + local_b8.m128[2] * fVar17;
          auVar60._0_4_ = fVar35 * local_c8 + fVar17 * local_a8;
          auVar60._4_4_ = fVar35 * fStack_c4 + fVar17 * fStack_a4;
          auVar60._8_4_ = fVar35 * fStack_c0 + fVar17 * fStack_a0;
        }
        else {
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_58.field_1,&local_f0,(long)((int)fVar35 + 1));
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_78.field_1,&local_f0,(long)((int)fVar155 + -1));
          fVar33 = fVar34 - fVar35;
          if (fVar34 - fVar35 <= 0.0) {
            fVar33 = 0.0;
          }
          fVar35 = 1.0 - fVar33;
          auVar128._0_4_ = local_b8.m128[0] * fVar35 + local_58.m128[0] * fVar33;
          auVar128._4_4_ = local_b8.m128[1] * fVar35 + local_58.m128[1] * fVar33;
          auVar128._8_4_ = local_b8.m128[2] * fVar35 + local_58.m128[2] * fVar33;
          auVar130._12_4_ = local_b8.m128[3] * fVar35 + local_58.m128[3] * fVar33;
          auVar130._0_12_ = auVar128;
          auVar111._0_4_ = fVar35 * local_a8 + fVar33 * local_48;
          auVar111._4_4_ = fVar35 * fStack_a4 + fVar33 * fStack_44;
          auVar111._8_4_ = fVar35 * fStack_a0 + fVar33 * fStack_40;
          auVar117._12_4_ = fVar35 * fStack_9c + fVar33 * fStack_3c;
          auVar117._0_12_ = auVar111;
          fVar35 = fVar155 - fVar160;
          if (fVar155 - fVar160 <= 0.0) {
            fVar35 = 0.0;
          }
          fVar34 = 1.0 - fVar35;
          auVar146._0_8_ =
               CONCAT44(local_d8.m128[1] * fVar34 + local_78.m128[1] * fVar35,
                        local_d8.m128[0] * fVar34 + local_78.m128[0] * fVar35);
          auVar146._8_4_ = local_d8.m128[2] * fVar34 + local_78.m128[2] * fVar35;
          auVar146._12_4_ = local_d8.m128[3] * fVar34 + local_78.m128[3] * fVar35;
          auVar104._0_8_ =
               CONCAT44(fVar34 * fStack_c4 + fVar35 * fStack_64,
                        fVar34 * local_c8 + fVar35 * local_68);
          auVar104._8_4_ = fVar34 * fStack_c0 + fVar35 * fStack_60;
          auVar104._12_4_ = fVar34 * fStack_bc + fVar35 * fStack_5c;
          if ((int)(uVar27 + 1) < iVar24) {
            sVar29 = (size_t)(uVar27 + 1);
            iVar24 = ~uVar27 + iVar24;
            do {
              fVar35 = ((float)(int)sVar29 / fVar17 - fVar73) / (fVar32 - fVar73);
              fVar33 = 1.0 - fVar35;
              fVar34 = auVar146._12_4_;
              fVar160 = auVar104._12_4_;
              linearBounds::anon_class_16_2_07cfa4d6::operator()
                        ((BBox3fa *)&local_98.field_1,&local_f0,sVar29);
              auVar57._0_4_ = local_98.m128[0] - (auVar130._0_4_ * fVar33 + auVar146._0_4_ * fVar35)
              ;
              auVar57._4_4_ = local_98.m128[1] - (auVar130._4_4_ * fVar33 + auVar146._4_4_ * fVar35)
              ;
              auVar57._8_4_ = local_98.m128[2] - (auVar130._8_4_ * fVar33 + auVar146._8_4_ * fVar35)
              ;
              auVar57._12_4_ = local_98.m128[3] - (auVar130._12_4_ * fVar33 + fVar34 * fVar35);
              auVar68._0_4_ = local_88 - (fVar33 * auVar117._0_4_ + fVar35 * auVar104._0_4_);
              auVar68._4_4_ = fStack_84 - (fVar33 * auVar117._4_4_ + fVar35 * auVar104._4_4_);
              auVar68._8_4_ = fStack_80 - (fVar33 * auVar117._8_4_ + fVar35 * auVar104._8_4_);
              auVar68._12_4_ = fStack_7c - (fVar33 * auVar117._12_4_ + fVar35 * fVar160);
              auVar112 = minps(auVar57,ZEXT816(0));
              auVar161 = maxps(auVar68,ZEXT816(0));
              auVar128._0_4_ = auVar130._0_4_ + auVar112._0_4_;
              auVar128._4_4_ = auVar130._4_4_ + auVar112._4_4_;
              auVar128._8_4_ = auVar130._8_4_ + auVar112._8_4_;
              auVar130._12_4_ = auVar130._12_4_ + auVar112._12_4_;
              auVar130._0_12_ = auVar128;
              auVar36._0_8_ =
                   CONCAT44(auVar112._4_4_ + auVar146._4_4_,auVar112._0_4_ + auVar146._0_4_);
              auVar36._8_4_ = auVar112._8_4_ + auVar146._8_4_;
              auVar111._0_4_ = auVar117._0_4_ + auVar161._0_4_;
              auVar111._4_4_ = auVar117._4_4_ + auVar161._4_4_;
              auVar111._8_4_ = auVar117._8_4_ + auVar161._8_4_;
              auVar117._12_4_ = auVar117._12_4_ + auVar161._12_4_;
              auVar117._0_12_ = auVar111;
              auVar60._0_8_ =
                   CONCAT44(auVar161._4_4_ + auVar104._4_4_,auVar161._0_4_ + auVar104._0_4_);
              auVar60._8_4_ = auVar161._8_4_ + auVar104._8_4_;
              sVar29 = sVar29 + 1;
              auVar104._8_4_ = auVar60._8_4_;
              auVar104._0_8_ = auVar60._0_8_;
              auVar104._12_4_ = auVar161._12_4_ + fVar160;
              auVar146._8_4_ = auVar36._8_4_;
              auVar146._0_8_ = auVar36._0_8_;
              auVar146._12_4_ = auVar112._12_4_ + fVar34;
              iVar24 = iVar24 + -1;
            } while (iVar24 != 0);
          }
          else {
            auVar36._8_4_ = auVar146._8_4_;
            auVar36._0_8_ = auVar146._0_8_;
            auVar60._8_4_ = auVar104._8_4_;
            auVar60._0_8_ = auVar104._0_8_;
          }
        }
        fVar17 = (float)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        uVar18 = (ulong)(uint)fVar17;
        aVar131.m128[3] = (float)geomID;
        aVar131._0_12_ = auVar128;
        aVar118.m128[3] = (float)uVar30;
        aVar118._0_12_ = auVar111;
        aVar58.m128[3] = fVar17;
        aVar58._0_12_ = auVar36;
        aVar69.m128[3] = fVar17;
        aVar69._0_12_ = auVar60;
        auVar82._0_4_ =
             auVar111._0_4_ * 0.5 + auVar60._0_4_ * 0.5 + auVar128._0_4_ * 0.5 + auVar36._0_4_ * 0.5
        ;
        auVar82._4_4_ =
             auVar111._4_4_ * 0.5 + auVar60._4_4_ * 0.5 + auVar128._4_4_ * 0.5 + auVar36._4_4_ * 0.5
        ;
        auVar82._8_4_ =
             auVar111._8_4_ * 0.5 + auVar60._8_4_ * 0.5 + auVar128._8_4_ * 0.5 + auVar36._8_4_ * 0.5
        ;
        auVar82._12_4_ = (float)uVar30 * 0.5 + fVar17 * 0.5 + (float)geomID * 0.5 + fVar17 * 0.5;
        BVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                super_Geometry.time_range;
        local_228.m128 = (__m128)minps(local_228.m128,aVar131.m128);
        local_288 = local_288 + 1;
        local_280 = local_280 + uVar18;
        bVar31 = local_2f8 < uVar18;
        if (local_2f8 <= uVar18) {
          local_2f8 = uVar18;
        }
        pPVar7 = prims->items;
        pPVar7[local_278].lbounds.bounds0.lower.field_0 = aVar131;
        local_238.m128 = (__m128)maxps(local_238.m128,aVar118.m128);
        pPVar7[local_278].lbounds.bounds0.upper.field_0 = aVar118;
        aVar119.m128 = (__m128)minps(aVar119.m128,aVar58.m128);
        pPVar7[local_278].lbounds.bounds1.lower.field_0 = aVar58;
        aVar105.m128 = (__m128)maxps(aVar105.m128,aVar69.m128);
        pPVar7[local_278].lbounds.bounds1.upper.field_0 = aVar69;
        pPVar7[local_278].time_range = BVar3;
        aVar92.m128 = (__m128)minps(aVar92.m128,auVar82);
        local_248.m128 = (__m128)maxps(local_248.m128,auVar82);
        fVar17 = BVar3.lower;
        if (fVar17 <= local_390) {
          local_390 = fVar17;
        }
        fVar34 = BVar3.upper;
        fVar35 = fVar34;
        if (fVar34 <= local_38c) {
          fVar35 = local_38c;
        }
        uVar27 = (int)((uint)bVar31 << 0x1f) >> 0x1f;
        uVar20 = (int)((uint)bVar31 << 0x1f) >> 0x1f;
        local_278 = local_278 + 1;
        local_218.upper = (float)(~uVar20 & (uint)local_218.upper | (uint)fVar34 & uVar20);
        local_218.lower = (float)(~uVar27 & (uint)local_218.lower | (uint)fVar17 & uVar27);
        local_38c = fVar35;
      }
LAB_00a6de96:
      uVar30 = uVar30 + 1;
    } while (uVar30 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_288;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = local_228;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = local_238;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar119;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar105;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar92;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_248;
  (__return_storage_ptr__->time_range).lower = local_390;
  (__return_storage_ptr__->time_range).upper = local_38c;
  __return_storage_ptr__->num_time_segments = local_280;
  __return_storage_ptr__->max_num_time_segments = local_2f8;
  __return_storage_ptr__->max_time_range = local_218;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }